

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCpRestore<(moira::Instr)150,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  char *pcVar1;
  long lVar2;
  char cVar3;
  Ea<(moira::Mode)3,_2> ea;
  u32 local_24;
  ushort local_20;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)150,(moira::Mode)3,2>(this,str,addr,op);
    return;
  }
  local_20 = op & 7;
  local_24 = *addr;
  s = &str->ptr;
  sprintd_signed(s,(ulong)(op >> 9 & 7));
  cVar3 = 'r';
  lVar2 = 1;
  do {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    *pcVar1 = cVar3;
    cVar3 = "frestore"[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  pcVar1 = str->ptr;
  str->ptr = pcVar1 + 1;
  *pcVar1 = ' ';
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_2> *)&local_24);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar3 = ';';
    lVar2 = 1;
    do {
      pcVar1 = *s;
      *s = pcVar1 + 1;
      *pcVar1 = cVar3;
      cVar3 = "%dgen    %s; (2-3)"[lVar2 + 0xb];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  return;
}

Assistant:

void
Moira::dasmCpRestore(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto dn = ( _____________xxx(op) );
    auto id = ( ____xxx_________(op) );
    auto ea = Op <M,S> (dn, addr);

    str << id << Ins<I>{} << " " << ea;
    str << Av<I, M, S>{};
}